

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SeekAndScan<true>
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,RestorePoint *restorePoint)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RestorePoint *restorePoint_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  this->m_currentCharacter =
       this->m_pchBase + restorePoint->m_cMinTokMultiUnits + (ulong)restorePoint->m_ichMinTok;
  this->m_pchMinLine =
       this->m_pchBase + restorePoint->m_cMinLineMultiUnits + (ulong)restorePoint->m_ichMinLine;
  this->m_cMinLineMultiUnits = restorePoint->m_cMinLineMultiUnits;
  UTF8EncodingPolicyBase<false>::RestoreMultiUnits
            (&this->super_UTF8EncodingPolicyBase<false>,restorePoint->m_cMinTokMultiUnits);
  ScanForcingPid(this);
  this->m_line = restorePoint->m_line;
  this->m_fHadEol = restorePoint->m_fHadEol;
  Parser::ReduceDeferredScriptLength(this->m_parser,restorePoint->lengthDecr);
  if ((this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits != restorePoint->m_cMultiUnits) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x919,"(this->m_cMultiUnits == restorePoint.m_cMultiUnits)",
                       "this->m_cMultiUnits == restorePoint.m_cMultiUnits");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void Scanner<EncodingPolicy>::SeekAndScan(const RestorePoint& restorePoint)
{
    this->m_currentCharacter = this->m_pchBase + restorePoint.m_ichMinTok + restorePoint.m_cMinTokMultiUnits;
    this->m_pchMinLine = this->m_pchBase + restorePoint.m_ichMinLine + restorePoint.m_cMinLineMultiUnits;
    this->m_cMinLineMultiUnits = restorePoint.m_cMinLineMultiUnits;
    this->RestoreMultiUnits(restorePoint.m_cMinTokMultiUnits);

    if (forcePid)
    {
        this->ScanForcingPid();
    }
    else
    {
        this->Scan();
    }

    this->m_line = restorePoint.m_line;
    this->m_fHadEol = restorePoint.m_fHadEol;

    this->m_parser->ReduceDeferredScriptLength(restorePoint.lengthDecr);

    Assert(this->m_cMultiUnits == restorePoint.m_cMultiUnits);
}